

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.cxx
# Opt level: O0

void FileParse::trimTrailingZeros(string *str,bool useScientific)

{
  size_type sVar1;
  size_type sVar2;
  reference pvVar3;
  size_type dotEPos;
  size_type lastNonZero;
  size_type ePos;
  bool useScientific_local;
  string *str_local;
  
  if (useScientific) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(str,"eE",0);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(str,'0',sVar1 - 1);
    if ((sVar2 != 0xffffffffffffffff) && (sVar2 + 1 < sVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,sVar2 + 1,(sVar1 - sVar2) - 1);
    }
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(str,".eE",sVar2);
    if (((sVar1 != 0xffffffffffffffff) &&
        (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(str), sVar1 + 1 < sVar2)) &&
       ((pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](str,sVar1 + 1), *pvVar3 == 'e' ||
        (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](str,sVar1 + 1), *pvVar3 == 'E')))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,sVar1,1);
    }
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(str,'0',0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (str,sVar1 + 1,0xffffffffffffffff);
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (str);
    if (*pvVar3 == '.') {
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(str);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,sVar1 - 1,0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

void trimTrailingZeros(std::string & str, bool useScientific)
    {
        if(useScientific)
        {
            // Find the exponent and trim zeros before it
            auto ePos = str.find_first_of("eE");
            auto lastNonZero = str.find_last_not_of('0', ePos - 1);
            if(lastNonZero != std::string::npos && lastNonZero + 1 < ePos)
            {
                str.erase(lastNonZero + 1, ePos - lastNonZero - 1);
            }
            // Remove the decimal point if it's directly before 'e' or 'E'
            auto dotEPos = str.find_first_of(".eE", lastNonZero);
            if (dotEPos != std::string::npos &&
               (dotEPos + 1 < str.size()) &&
               (str[dotEPos + 1] == 'e' || str[dotEPos + 1] == 'E'))
            {
                str.erase(dotEPos, 1);
            }

        }
        else
        {
            // Remove trailing zeros for non-scientific notation
            str.erase(str.find_last_not_of('0') + 1, std::string::npos);
            // Remove decimal point if no decimal part remains
            if(str.back() == '.')
            {
                str.erase(str.length() - 1);
            }
        }
    }